

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::StructDatePart::DeserializeFunction
          (Deserializer *deserializer,ScalarFunction *bound_function)

{
  BindData *this;
  LogicalType stype;
  vector<duckdb::DatePartSpecifier,_true> part_codes;
  Deserializer local_40 [24];
  type local_28;
  
  (**(code **)(*(long *)bound_function + 0x10))(bound_function,100,"stype");
  (**(code **)(*(long *)bound_function + 0x30))(bound_function);
  duckdb::LogicalType::Deserialize(local_40);
  (**(code **)(*(long *)bound_function + 0x38))(bound_function);
  (**(code **)(*(long *)bound_function + 0x18))(bound_function);
  (**(code **)(*(long *)bound_function + 0x10))(bound_function,0x65,"part_codes");
  Deserializer::Read<duckdb::vector<duckdb::DatePartSpecifier,true>>
            (&local_28,(Deserializer *)bound_function);
  (**(code **)(*(long *)bound_function + 0x18))(bound_function);
  this = (BindData *)operator_new(0x38);
  BindData::BindData(this,(LogicalType *)local_40,&local_28);
  *(BindData **)deserializer = this;
  if (local_28.super_vector<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>.
      super__Vector_base<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super_vector<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>
                    .
                    super__Vector_base<duckdb::DatePartSpecifier,_std::allocator<duckdb::DatePartSpecifier>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  duckdb::LogicalType::~LogicalType((LogicalType *)local_40);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)deserializer;
}

Assistant:

static unique_ptr<FunctionData> DeserializeFunction(Deserializer &deserializer, ScalarFunction &bound_function) {
		auto stype = deserializer.ReadProperty<LogicalType>(100, "stype");
		auto part_codes = deserializer.ReadProperty<vector<DatePartSpecifier>>(101, "part_codes");
		return make_uniq<BindData>(std::move(stype), std::move(part_codes));
	}